

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LexerTests.cpp
# Opt level: O2

void testExpect(TokenKind kind)

{
  Token matchingDelim;
  bool bVar1;
  SourceLocation SVar2;
  Token TVar3;
  span<const_slang::parsing::Trivia,_18446744073709551615UL> sVar4;
  string_view sVar5;
  StringRef capturedExpression;
  StringRef capturedExpression_00;
  StringRef capturedExpression_01;
  StringRef capturedExpression_02;
  StringRef capturedExpression_03;
  StringRef capturedExpression_04;
  StringRef macroName;
  StringRef macroName_00;
  StringRef macroName_01;
  StringRef macroName_02;
  StringRef macroName_03;
  StringRef macroName_04;
  TokenKind kind_local;
  AssertionHandler catchAssertionHandler;
  Token token;
  ITransientExpression local_a0;
  Token *local_90;
  char *local_88;
  undefined8 local_80;
  TokenKind *local_78;
  undefined8 local_70;
  char *pcStack_68;
  Token local_60;
  Token local_50;
  Token actual;
  
  kind_local = kind;
  slang::SmallVectorBase<slang::Diagnostic>::clear
            ((SmallVectorBase<slang::Diagnostic> *)&slang::diagnostics);
  local_70 = 3;
  pcStack_68 = "SDF";
  sVar5._M_str = "SDF";
  sVar5._M_len = 3;
  slang::parsing::Token::Token
            (&actual,(BumpAllocator *)slang::alloc,Identifier,
             (span<const_slang::parsing::Trivia,_18446744073709551615UL>)ZEXT816(0),sVar5,
             (SourceLocation)0x50000001);
  slang::parsing::Token::Token(&local_50);
  slang::parsing::Token::Token(&local_60);
  TVar3.info = local_50.info;
  TVar3.kind = local_50.kind;
  TVar3._2_1_ = local_50._2_1_;
  TVar3.numFlags.raw = local_50.numFlags.raw;
  TVar3.rawLen = local_50.rawLen;
  matchingDelim.info = local_60.info;
  matchingDelim.kind = local_60.kind;
  matchingDelim._2_1_ = local_60._2_1_;
  matchingDelim.numFlags.raw = local_60.numFlags.raw;
  matchingDelim.rawLen = local_60.rawLen;
  TVar3 = slang::parsing::Token::createExpected
                    ((BumpAllocator *)slang::alloc,(Diagnostics *)&slang::diagnostics,actual,kind,
                     TVar3,matchingDelim);
  local_a0._vptr_ITransientExpression = (_func_int **)0x88d9a8;
  local_a0.m_isBinaryExpression = true;
  local_a0.m_result = true;
  local_a0._10_6_ = 0;
  capturedExpression.m_size = 0x12;
  capturedExpression.m_start = "token.kind == kind";
  macroName.m_size = 5;
  macroName.m_start = "CHECK";
  token = TVar3;
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName,(SourceLineInfo *)&local_a0,capturedExpression,
             ContinueOnFailure);
  local_a0.m_result = TVar3.kind == kind;
  local_a0.m_isBinaryExpression = true;
  local_a0._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_00b65be8;
  local_88 = "==";
  local_80 = 2;
  local_78 = &kind_local;
  local_90 = &token;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_a0);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_a0._vptr_ITransientExpression = (_func_int **)0x88d9a8;
  local_a0.m_isBinaryExpression = true;
  local_a0.m_result = true;
  local_a0._10_6_ = 0;
  capturedExpression_00.m_size = 0x16;
  capturedExpression_00.m_start = "token.trivia().empty()";
  macroName_00.m_size = 5;
  macroName_00.m_start = "CHECK";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_00,(SourceLineInfo *)&local_a0,capturedExpression_00,
             ContinueOnFailure);
  sVar4 = slang::parsing::Token::trivia(&token);
  local_a0._vptr_ITransientExpression =
       (_func_int **)
       CONCAT71(local_a0._vptr_ITransientExpression._1_7_,
                sVar4._M_extent._M_extent_value._M_extent_value == 0);
  Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_a0);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_a0._vptr_ITransientExpression = (_func_int **)0x88d9a8;
  local_a0.m_isBinaryExpression = true;
  local_a0.m_result = true;
  local_a0._10_6_ = 0;
  capturedExpression_01.m_size = 0x1e;
  capturedExpression_01.m_start = "token.location().offset() == 5";
  macroName_01.m_size = 5;
  macroName_01.m_start = "CHECK";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_01,(SourceLineInfo *)&local_a0,capturedExpression_01,
             ContinueOnFailure);
  SVar2 = slang::parsing::Token::location(&token);
  local_90 = (Token *)((ulong)SVar2 >> 0x1c);
  local_a0.m_result = local_90 == (Token *)0x5;
  local_a0.m_isBinaryExpression = true;
  local_a0._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_00b63320;
  local_88 = "==";
  local_80 = 2;
  local_78 = (TokenKind *)CONCAT44(local_78._4_4_,5);
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_a0);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_a0._vptr_ITransientExpression = (_func_int **)0x88d9a8;
  local_a0.m_isBinaryExpression = true;
  local_a0.m_result = true;
  local_a0._10_6_ = 0;
  capturedExpression_02.m_size = 0x11;
  capturedExpression_02.m_start = "token.isMissing()";
  macroName_02.m_size = 5;
  macroName_02.m_start = "CHECK";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_02,(SourceLineInfo *)&local_a0,capturedExpression_02,
             ContinueOnFailure);
  local_a0._vptr_ITransientExpression =
       (_func_int **)
       (CONCAT71(local_a0._vptr_ITransientExpression._1_7_,token._2_1_) & 0xffffffffffffff01);
  Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_a0);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  bVar1 = slang::parsing::LexerFacts::isKeyword(kind_local);
  if (!bVar1) {
    local_a0._vptr_ITransientExpression = (_func_int **)0x88d9a8;
    local_a0.m_isBinaryExpression = true;
    local_a0.m_result = true;
    local_a0._10_6_ = 0;
    capturedExpression_03.m_size = 0x19;
    capturedExpression_03.m_start = "token.valueText().empty()";
    macroName_03.m_size = 5;
    macroName_03.m_start = "CHECK";
    Catch::AssertionHandler::AssertionHandler
              (&catchAssertionHandler,macroName_03,(SourceLineInfo *)&local_a0,capturedExpression_03
               ,ContinueOnFailure);
    sVar5 = slang::parsing::Token::valueText(&token);
    local_a0._vptr_ITransientExpression =
         (_func_int **)CONCAT71(local_a0._vptr_ITransientExpression._1_7_,sVar5._M_len == 0);
    Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_a0);
    Catch::AssertionHandler::complete(&catchAssertionHandler);
    Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
    local_a0._vptr_ITransientExpression = (_func_int **)0x88d9a8;
    local_a0.m_isBinaryExpression = true;
    local_a0.m_result = true;
    local_a0._10_6_ = 0;
    capturedExpression_04.m_size = 0x17;
    capturedExpression_04.m_start = "token.rawText().empty()";
    macroName_04.m_size = 5;
    macroName_04.m_start = "CHECK";
    Catch::AssertionHandler::AssertionHandler
              (&catchAssertionHandler,macroName_04,(SourceLineInfo *)&local_a0,capturedExpression_04
               ,ContinueOnFailure);
    sVar5 = slang::parsing::Token::rawText(&token);
    local_a0._vptr_ITransientExpression =
         (_func_int **)CONCAT71(local_a0._vptr_ITransientExpression._1_7_,sVar5._M_len == 0);
    Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_a0);
    Catch::AssertionHandler::complete(&catchAssertionHandler);
    Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  }
  return;
}

Assistant:

void testExpect(TokenKind kind) {
    diagnostics.clear();
    Token actual(alloc, TokenKind::Identifier, {}, "SDF", SourceLocation(BufferID(1, "asdf"), 5));
    Token token = Token::createExpected(alloc, diagnostics, actual, kind, Token(), Token());

    CHECK(token.kind == kind);
    CHECK(token.trivia().empty());
    CHECK(token.location().offset() == 5);
    CHECK(token.isMissing());

    if (!LF::isKeyword(kind)) {
        CHECK(token.valueText().empty());
        CHECK(token.rawText().empty());
    }
}